

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_canvas.c
# Opt level: O3

int canvas_open(_glist *x,char *name,char *ext,char *dirresult,char **nameresult,uint size,int bin)

{
  int iVar1;
  int fd;
  t_canvasopen co;
  int local_64;
  char *local_60;
  char *local_58;
  char *local_50;
  char **local_48;
  uint local_40;
  int local_3c;
  int local_38;
  
  local_64 = -1;
  iVar1 = sys_open_absolute(name,ext,dirresult,nameresult,size,bin,&local_64);
  local_38 = local_64;
  if (iVar1 == 0) {
    local_3c = bin;
    local_38 = -1;
    local_60 = name;
    local_58 = ext;
    local_50 = dirresult;
    local_48 = nameresult;
    local_40 = size;
    canvas_path_iterate(x,canvas_open_iter,&local_60);
  }
  return local_38;
}

Assistant:

int canvas_open(const t_canvas *x, const char *name, const char *ext,
    char *dirresult, char **nameresult, unsigned int size, int bin)
{
    int fd = -1;
    t_canvasopen co;

        /* first check if "name" is absolute (and if so, try to open) */
    if (sys_open_absolute(name, ext, dirresult, nameresult, size, bin, &fd))
        return (fd);

        /* otherwise "name" is relative; iterate over all the search-paths */
    co.name = name;
    co.ext = ext;
    co.dirresult = dirresult;
    co.nameresult = nameresult;
    co.size = size;
    co.bin = bin;
    co.fd = -1;

    canvas_path_iterate(x, (t_canvas_path_iterator)canvas_open_iter, &co);

    return (co.fd);
}